

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make-posix.cc
# Opt level: O0

bool __thiscall GNUmakeTokenPoolPosix::ReturnToken(GNUmakeTokenPoolPosix *this)

{
  ssize_t sVar1;
  int *piVar2;
  undefined1 local_19;
  int ret;
  char buf;
  GNUmakeTokenPoolPosix *this_local;
  
  local_19 = 0x2b;
  _ret = this;
  do {
    sVar1 = write(this->wfd_,&local_19,1);
    if (0 < (int)sVar1) {
      return true;
    }
  } while (((int)sVar1 == -1) && (piVar2 = __errno_location(), *piVar2 == 4));
  return false;
}

Assistant:

bool GNUmakeTokenPoolPosix::ReturnToken() {
  const char buf = '+';
  while (1) {
    int ret = write(wfd_, &buf, 1);
    if (ret > 0)
      return true;
    if ((ret != -1) || (errno != EINTR))
      return false;
    // write got interrupted - retry
  }
}